

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

HDF5DataParameter * __thiscall caffe::LayerParameter::mutable_hdf5_data_param(LayerParameter *this)

{
  HDF5DataParameter *this_00;
  LayerParameter *this_local;
  
  set_has_hdf5_data_param(this);
  if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
    this_00 = (HDF5DataParameter *)operator_new(0x28);
    HDF5DataParameter::HDF5DataParameter(this_00);
    this->hdf5_data_param_ = this_00;
  }
  return this->hdf5_data_param_;
}

Assistant:

inline ::caffe::HDF5DataParameter* LayerParameter::mutable_hdf5_data_param() {
  set_has_hdf5_data_param();
  if (hdf5_data_param_ == NULL) {
    hdf5_data_param_ = new ::caffe::HDF5DataParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.hdf5_data_param)
  return hdf5_data_param_;
}